

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

sfxinfo_t * S_LoadSound(sfxinfo_t *sfx)

{
  uint uVar1;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  ushort uVar7;
  int iVar8;
  uint length;
  BYTE *sfxdata;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long lVar9;
  ulong uVar10;
  pair<SoundHandle,_bool> pVar11;
  sfxinfo_t *local_78;
  FWadLump wlump;
  undefined1 auVar2 [12];
  
  iVar8 = (*GSnd->_vptr_SoundRenderer[2])();
  if ((char)iVar8 == '\0') {
    do {
      if ((sfx->data).data != (void *)0x0) {
        return sfx;
      }
      if (sfx->lumpnum == -1) {
        sfx->lumpnum = sfx_empty;
      }
      if ((ulong)S_sfx.Count != 0) {
        uVar10 = 0;
        lVar9 = 0;
        do {
          if (((*(long *)((long)&((S_sfx.Array)->data).data + lVar9) != 0) &&
              (*(int *)((long)&(S_sfx.Array)->link + lVar9) == -1)) &&
             (*(int *)((long)&(S_sfx.Array)->lumpnum + lVar9) == sfx->lumpnum)) {
            DPrintf(3,"Linked %s to %s (%d)\n",(sfx->name).Chars,
                    *(undefined8 *)((long)&((S_sfx.Array)->name).Chars + lVar9),uVar10);
            sfx->link = (uint)uVar10;
            if ((sfx->Rolloff).MinDistance == 0.0) {
              (sfx->Rolloff).field_2 = S_Rolloff.field_2;
              fVar6 = S_Rolloff.MinDistance;
              (sfx->Rolloff).RolloffType = S_Rolloff.RolloffType;
              (sfx->Rolloff).MinDistance = fVar6;
            }
            local_78 = (sfxinfo_t *)((long)&((S_sfx.Array)->data).data + lVar9);
            iVar8 = 1;
            goto LAB_00324d80;
          }
          lVar9 = lVar9 + 0x50;
          uVar10 = (ulong)((uint)uVar10 + 1);
        } while ((ulong)S_sfx.Count * 0x50 != lVar9);
      }
      DPrintf(3,"Loading sound \"%s\" (%td)\n",(sfx->name).Chars);
      length = FWadCollection::LumpLength(&Wads,sfx->lumpnum);
      if (0 < (int)length) {
        FWadCollection::OpenLumpNum(&wlump,&Wads,sfx->lumpnum);
        sfxdata = (BYTE *)operator_new__((ulong)length);
        FWadLump::Read(&wlump,sfxdata,(ulong)length);
        uVar1 = *(uint *)(sfxdata + 4);
        iVar8 = strncmp((char *)sfxdata,"Creative Voice File",0x13);
        if (iVar8 == 0) {
          pVar11 = SoundRenderer::LoadSoundVoc(GSnd,sfxdata,length,false);
          auVar2 = pVar11._0_12_;
        }
        else if ((sfx->field_0x30 & 4) == 0) {
          if ((*sfxdata == '\x03') && ((int)uVar1 <= (int)(length - 8) && sfxdata[1] == '\0')) {
            uVar7 = *(ushort *)(sfxdata + 2);
            if (*(ushort *)(sfxdata + 2) == 0) {
              uVar7 = 0x2b11;
            }
            iVar8 = (*GSnd->_vptr_SoundRenderer[6])
                              (GSnd,sfxdata + 8,(ulong)uVar1,(ulong)uVar7,1,8,
                               (ulong)(uint)sfx->LoopStart,0xffffffffffffffff,0);
            auVar4._4_4_ = extraout_var_01;
            auVar4._0_4_ = iVar8;
            auVar4._8_8_ = extraout_RDX_01;
            auVar2 = auVar4._0_12_;
          }
          else {
            iVar8 = (*GSnd->_vptr_SoundRenderer[5])(GSnd,sfxdata,(ulong)length,0);
            auVar3._4_4_ = extraout_var;
            auVar3._0_4_ = iVar8;
            auVar3._8_8_ = extraout_RDX;
            auVar2 = auVar3._0_12_;
          }
        }
        else {
          iVar8 = (*GSnd->_vptr_SoundRenderer[6])
                            (GSnd,sfxdata,(ulong)length,(ulong)sfx->RawRate,1,8,
                             (ulong)(uint)sfx->LoopStart,0xffffffffffffffff,0);
          auVar5._4_4_ = extraout_var_00;
          auVar5._0_4_ = iVar8;
          auVar5._8_8_ = extraout_RDX_00;
          auVar2 = auVar5._0_12_;
        }
        operator_delete__(sfxdata);
        (sfx->data).data = auVar2._0_8_;
        if ((auVar2 & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
          (sfx->data3d).data = auVar2._0_8_;
        }
        FWadLump::~FWadLump(&wlump);
      }
      iVar8 = 3;
      if (((sfx->data).data == (void *)0x0) && (sfx->lumpnum != sfx_empty)) {
        sfx->lumpnum = sfx_empty;
        iVar8 = 2;
      }
LAB_00324d80:
    } while (iVar8 == 2);
    if (iVar8 != 3) {
      sfx = local_78;
    }
  }
  return sfx;
}

Assistant:

sfxinfo_t *S_LoadSound(sfxinfo_t *sfx)
{
	if (GSnd->IsNull()) return sfx;

	while (!sfx->data.isValid())
	{
		unsigned int i;

		// If the sound doesn't exist, replace it with the empty sound.
		if (sfx->lumpnum == -1)
		{
			sfx->lumpnum = sfx_empty;
		}
		
		// See if there is another sound already initialized with this lump. If so,
		// then set this one up as a link, and don't load the sound again.
		for (i = 0; i < S_sfx.Size(); i++)
		{
			if (S_sfx[i].data.isValid() && S_sfx[i].link == sfxinfo_t::NO_LINK && S_sfx[i].lumpnum == sfx->lumpnum)
			{
				DPrintf (DMSG_NOTIFY, "Linked %s to %s (%d)\n", sfx->name.GetChars(), S_sfx[i].name.GetChars(), i);
				sfx->link = i;
				// This is necessary to avoid using the rolloff settings of the linked sound if its
				// settings are different.
				if (sfx->Rolloff.MinDistance == 0) sfx->Rolloff = S_Rolloff;
				return &S_sfx[i];
			}
		}

		DPrintf(DMSG_NOTIFY, "Loading sound \"%s\" (%td)\n", sfx->name.GetChars(), sfx - &S_sfx[0]);

		int size = Wads.LumpLength(sfx->lumpnum);
		if (size > 0)
		{
			FWadLump wlump = Wads.OpenLumpNum(sfx->lumpnum);
			BYTE *sfxdata = new BYTE[size];
			wlump.Read(sfxdata, size);
			SDWORD dmxlen = LittleLong(((SDWORD *)sfxdata)[1]);
            std::pair<SoundHandle,bool> snd;

			// If the sound is voc, use the custom loader.
			if (strncmp ((const char *)sfxdata, "Creative Voice File", 19) == 0)
			{
				snd = GSnd->LoadSoundVoc(sfxdata, size);
			}
			// If the sound is raw, just load it as such.
			else if (sfx->bLoadRAW)
			{
				snd = GSnd->LoadSoundRaw(sfxdata, size, sfx->RawRate, 1, 8, sfx->LoopStart);
			}
			// Otherwise, try the sound as DMX format.
			else if (((BYTE *)sfxdata)[0] == 3 && ((BYTE *)sfxdata)[1] == 0 && dmxlen <= size - 8)
			{
				int frequency = LittleShort(((WORD *)sfxdata)[1]);
				if (frequency == 0) frequency = 11025;
				snd = GSnd->LoadSoundRaw(sfxdata+8, dmxlen, frequency, 1, 8, sfx->LoopStart);
			}
			// If that fails, let the sound system try and figure it out.
			else
			{
				snd = GSnd->LoadSound(sfxdata, size);
			}
			delete[] sfxdata;

            sfx->data = snd.first;
            if(snd.second)
                sfx->data3d = sfx->data;
		}

		if (!sfx->data.isValid())
		{
			if (sfx->lumpnum != sfx_empty)
			{
				sfx->lumpnum = sfx_empty;
				continue;
			}
		}
		break;
	}
	return sfx;
}